

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O2

void __thiscall MockSupport::clear(MockSupport *this)

{
  MockNamedValueList *this_00;
  MockSupport *node;
  MockSupport *pMVar1;
  
  if (this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
    (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[1])();
  }
  this->lastActualFunctionCall_ = (MockCheckedActualCall *)0x0;
  this->tracing_ = false;
  MockActualCallTrace::clearInstance();
  MockExpectedCallsList::deleteAllExpectationsAndClearList(&this->expectations_);
  this->ignoreOtherCalls_ = false;
  this->enabled_ = true;
  this_00 = &this->data_;
  this->strictOrdering_ = false;
  this->actualCallOrder_ = 0;
  this->expectedCallOrder_ = 0;
  pMVar1 = (MockSupport *)this_00;
  for (node = (MockSupport *)MockNamedValueList::begin(this_00); node != (MockSupport *)0x0;
      node = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node)) {
    pMVar1 = getMockSupport(pMVar1,(MockNamedValueListNode *)node);
    if (pMVar1 != (MockSupport *)0x0) {
      (*pMVar1->_vptr_MockSupport[0x27])(pMVar1);
      (*pMVar1->_vptr_MockSupport[1])(pMVar1);
    }
    pMVar1 = node;
  }
  MockNamedValueList::clear(this_00);
  return;
}

Assistant:

void MockSupport::clear()
{
    delete lastActualFunctionCall_;
    lastActualFunctionCall_ = NULLPTR;

    tracing_ = false;
    MockActualCallTrace::clearInstance();

    expectations_.deleteAllExpectationsAndClearList();
    ignoreOtherCalls_ = false;
    enabled_ = true;
    actualCallOrder_ = 0;
    expectedCallOrder_ = 0;
    strictOrdering_ = false;

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next()) {
        MockSupport* support = getMockSupport(p);
        if (support) {
            support->clear();
            delete support;
        }
    }
    data_.clear();
}